

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_input_unmark(mpc_input_t *i)

{
  uint uVar1;
  int iVar2;
  mpc_state_t *pmVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (0 < i->backtrack) {
    iVar2 = i->marks_num;
    uVar1 = iVar2 - 1;
    i->marks_num = uVar1;
    if ((0x20 < i->marks_slots) && ((int)uVar1 / 2 + iVar2 + -1 < i->marks_slots)) {
      uVar6 = 0x20;
      if (0x21 < iVar2) {
        uVar6 = (ulong)uVar1;
      }
      i->marks_slots = (int)uVar6;
      pmVar3 = (mpc_state_t *)realloc(i->marks,uVar6 << 5);
      i->marks = pmVar3;
      pcVar4 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar4;
    }
    if ((i->type == 2) && (i->marks_num == 0)) {
      sVar5 = strlen(i->buffer);
      uVar6 = sVar5 & 0xffffffff;
      while( true ) {
        uVar6 = uVar6 - 1;
        if ((int)(uint)uVar6 < 0) break;
        ungetc((int)i->buffer[(uint)uVar6 & 0x7fffffff],(FILE *)i->file);
      }
      free(i->buffer);
      i->buffer = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void mpc_input_unmark(mpc_input_t *i) {
  int j;

  if (i->backtrack < 1) { return; }

  i->marks_num--;

  if (i->marks_slots > i->marks_num + i->marks_num / 2
  &&  i->marks_slots > MPC_INPUT_MARKS_MIN) {
    i->marks_slots =
      i->marks_num > MPC_INPUT_MARKS_MIN ?
      i->marks_num : MPC_INPUT_MARKS_MIN;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 0) {
    for (j = strlen(i->buffer) - 1; j >= 0; j--)
      ungetc(i->buffer[j], i->file);

    free(i->buffer);
    i->buffer = NULL;
  }

}